

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_magic_enum::containers::array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&,_const_magic_enum::containers::array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_magic_enum::containers::array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&,_const_magic_enum::containers::array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  *in_RDX;
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_> *range
  ;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  rangeToString<magic_enum::containers::array<Color,RGB,magic_enum::containers::detail::indexing<Color,std::less<Color>,void>>>
            (&local_40,(Catch *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  rangeToString<magic_enum::containers::array<Color,RGB,magic_enum::containers::detail::indexing<Color,std::less<Color>,void>>>
            (&local_60,(Catch *)this->m_rhs,range);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }